

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::GetCachedDatepartFunction<duckdb::DatePart::DayOperator>(void)

{
  duckdb *in_RDI;
  scalar_function_t local_68;
  scalar_function_t local_48;
  scalar_function_t local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object =
       DatePartCachedFunction<duckdb::DatePart::DayOperator,duckdb::date_t>;
  local_28._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object =
       DatePartCachedFunction<duckdb::DatePart::DayOperator,duckdb::timestamp_t>;
  local_48._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::DayOperator>;
  local_68._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<&(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>duckdb::InitDateCacheLocalState<duckdb::DatePart::DayOperator>(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))>
            (in_RDI,&local_28,&local_48,&local_68,
             DatePart::DayOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::DayOperator::PropagateStatistics<duckdb::timestamp_t>);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

ScalarFunctionSet GetCachedDatepartFunction() {
	return GetGenericDatePartFunction<InitDateCacheLocalState<OP>>(
	    DatePartCachedFunction<OP, date_t>, DatePartCachedFunction<OP, timestamp_t>,
	    ScalarFunction::UnaryFunction<interval_t, int64_t, OP>, OP::template PropagateStatistics<date_t>,
	    OP::template PropagateStatistics<timestamp_t>);
}